

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::Recover(VersionSet *this,bool *save_manifest)

{
  Env *env;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  Comparator *pCVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Version *this_00;
  undefined1 *in_RDX;
  bool local_511;
  Version *v;
  Slice local_4d8;
  Status local_4c8;
  Slice local_4c0;
  Slice local_4b0;
  Status local_4a0;
  Slice local_498;
  Slice local_488;
  Status local_478;
  Slice local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  Slice local_440;
  Status local_430;
  undefined1 local_428 [8];
  undefined1 local_420 [8];
  VersionEdit edit;
  string scratch;
  Slice record;
  Reader reader;
  LogReporter reporter;
  Builder builder;
  uint64_t prev_log_number;
  uint64_t log_number;
  uint64_t last_sequence;
  uint64_t next_file;
  undefined1 local_120 [4];
  bool have_last_sequence;
  bool have_next_file;
  bool have_prev_log_number;
  bool have_log_number;
  Slice local_100;
  Slice local_f0;
  Status local_e0;
  SequentialFile *local_d8;
  SequentialFile *file;
  undefined1 local_b0 [8];
  string dscname;
  Slice local_80;
  undefined4 local_6c;
  string local_68;
  Status local_48;
  Status s;
  string current;
  bool *save_manifest_local;
  VersionSet *this_local;
  
  std::__cxx11::string::string((string *)&s);
  env = *(Env **)save_manifest;
  CurrentFileName(&local_68,(string *)(save_manifest + 8));
  ReadFileToString((leveldb *)&local_48,env,&local_68,(string *)&s);
  std::__cxx11::string::~string((string *)&local_68);
  bVar4 = Status::ok(&local_48);
  if (bVar4) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&s);
      if (*pcVar8 == '\n') {
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&s);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (save_manifest + 8),"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
        std::__cxx11::string::~string((string *)&file);
        (**(code **)(**(long **)save_manifest + 0x10))
                  (&local_e0,*(long **)save_manifest,local_b0,&local_d8);
        Status::operator=(&local_48,&local_e0);
        Status::~Status(&local_e0);
        bVar4 = Status::ok(&local_48);
        if (bVar4) {
          bVar1 = false;
          bVar3 = false;
          bVar4 = false;
          bVar2 = false;
          last_sequence = 0;
          log_number = 0;
          prev_log_number = 0;
          builder.levels_[6].added_files = (FileSet *)0x0;
          Builder::Builder((Builder *)&reporter.status,(VersionSet *)save_manifest,
                           *(Version **)(save_manifest + 0x168));
          Recover::LogReporter::LogReporter((LogReporter *)&reader.resyncing_);
          reporter.super_Reporter._vptr_Reporter = (_func_int **)&local_48;
          log::Reader::Reader((Reader *)&record.size_,local_d8,(Reporter *)&reader.resyncing_,true,0
                             );
          Slice::Slice((Slice *)((long)&scratch.field_2 + 8));
          std::__cxx11::string::string
                    ((string *)
                     &edit.new_files_.
                      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          while( true ) {
            bVar5 = log::Reader::ReadRecord
                              ((Reader *)&record.size_,(Slice *)((long)&scratch.field_2 + 8),
                               (string *)
                               &edit.new_files_.
                                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_511 = false;
            if (bVar5) {
              local_511 = Status::ok(&local_48);
            }
            if (local_511 == false) break;
            VersionEdit::VersionEdit((VersionEdit *)local_420);
            VersionEdit::DecodeFrom((VersionEdit *)local_428,(Slice *)local_420);
            Status::operator=(&local_48,(Status *)local_428);
            Status::~Status((Status *)local_428);
            bVar5 = Status::ok(&local_48);
            if ((bVar5) && (((byte)edit.last_sequence_ & 1) != 0)) {
              pCVar9 = InternalKeyComparator::user_comparator
                                 ((InternalKeyComparator *)(save_manifest + 0x38));
              iVar6 = (*pCVar9->_vptr_Comparator[3])();
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_420,(char *)CONCAT44(extraout_var,iVar6));
              if (bVar5) {
                std::operator+(&local_460,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_420," does not match existing comparator ");
                Slice::Slice(&local_440,&local_460);
                pCVar9 = InternalKeyComparator::user_comparator
                                   ((InternalKeyComparator *)(save_manifest + 0x38));
                iVar6 = (*pCVar9->_vptr_Comparator[3])();
                Slice::Slice(&local_470,(char *)CONCAT44(extraout_var_00,iVar6));
                Status::InvalidArgument(&local_430,&local_440,&local_470);
                Status::operator=(&local_48,&local_430);
                Status::~Status(&local_430);
                std::__cxx11::string::~string((string *)&local_460);
              }
            }
            bVar5 = Status::ok(&local_48);
            if (bVar5) {
              Builder::Apply((Builder *)&reporter.status,(VersionEdit *)local_420);
            }
            if ((edit.last_sequence_._1_1_ & 1) != 0) {
              prev_log_number = edit.comparator_.field_2._8_8_;
              bVar1 = true;
            }
            if ((edit.last_sequence_._2_1_ & 1) != 0) {
              builder.levels_[6].added_files = (FileSet *)edit.log_number_;
              bVar3 = true;
            }
            if ((edit.last_sequence_._3_1_ & 1) != 0) {
              last_sequence = edit.prev_log_number_;
              bVar4 = true;
            }
            if ((edit.last_sequence_._4_1_ & 1) != 0) {
              log_number = edit.next_file_number_;
              bVar2 = true;
            }
            VersionEdit::~VersionEdit((VersionEdit *)local_420);
          }
          std::__cxx11::string::~string
                    ((string *)
                     &edit.new_files_.
                      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          log::Reader::~Reader((Reader *)&record.size_);
          Recover::LogReporter::~LogReporter((LogReporter *)&reader.resyncing_);
          if (local_d8 != (SequentialFile *)0x0) {
            (*local_d8->_vptr_SequentialFile[1])();
          }
          local_d8 = (SequentialFile *)0x0;
          bVar5 = Status::ok(&local_48);
          if (bVar5) {
            if (bVar4) {
              if (bVar1) {
                if (!bVar2) {
                  Slice::Slice(&local_4d8,"no last-sequence-number entry in descriptor");
                  Slice::Slice((Slice *)&v);
                  Status::Corruption(&local_4c8,&local_4d8,(Slice *)&v);
                  Status::operator=(&local_48,&local_4c8);
                  Status::~Status(&local_4c8);
                }
              }
              else {
                Slice::Slice(&local_4b0,"no meta-lognumber entry in descriptor");
                Slice::Slice(&local_4c0);
                Status::Corruption(&local_4a0,&local_4b0,&local_4c0);
                Status::operator=(&local_48,&local_4a0);
                Status::~Status(&local_4a0);
              }
            }
            else {
              Slice::Slice(&local_488,"no meta-nextfile entry in descriptor");
              Slice::Slice(&local_498);
              Status::Corruption(&local_478,&local_488,&local_498);
              Status::operator=(&local_48,&local_478);
              Status::~Status(&local_478);
            }
            if (!bVar3) {
              builder.levels_[6].added_files = (FileSet *)0x0;
            }
            MarkFileNumberUsed((VersionSet *)save_manifest,(uint64_t)builder.levels_[6].added_files)
            ;
            MarkFileNumberUsed((VersionSet *)save_manifest,prev_log_number);
          }
          bVar4 = Status::ok(&local_48);
          if (bVar4) {
            this_00 = (Version *)operator_new(0xe8);
            Version::Version(this_00,(VersionSet *)save_manifest);
            Builder::SaveTo((Builder *)&reporter.status,this_00);
            Finalize((VersionSet *)save_manifest,this_00);
            AppendVersion((VersionSet *)save_manifest,this_00);
            *(uint64_t *)(save_manifest + 0x50) = last_sequence;
            *(uint64_t *)(save_manifest + 0x48) = last_sequence + 1;
            *(uint64_t *)(save_manifest + 0x58) = log_number;
            *(uint64_t *)(save_manifest + 0x60) = prev_log_number;
            *(FileSet **)(save_manifest + 0x68) = builder.levels_[6].added_files;
            bVar4 = ReuseManifest((VersionSet *)save_manifest,(string *)local_b0,(string *)&s);
            if (!bVar4) {
              *in_RDX = 1;
            }
          }
          Status::Status((Status *)this,&local_48);
          local_6c = 1;
          Builder::~Builder((Builder *)&reporter.status);
        }
        else {
          bVar4 = Status::IsNotFound(&local_48);
          if (bVar4) {
            Slice::Slice(&local_f0,"CURRENT points to a non-existent file");
            Status::ToString_abi_cxx11_((string *)local_120,&local_48);
            Slice::Slice(&local_100,(string *)local_120);
            Status::Corruption((Status *)this,&local_f0,&local_100);
            std::__cxx11::string::~string((string *)local_120);
            local_6c = 1;
          }
          else {
            Status::Status((Status *)this,&local_48);
            local_6c = 1;
          }
        }
        std::__cxx11::string::~string((string *)local_b0);
        goto LAB_0013250e;
      }
    }
    Slice::Slice(&local_80,"CURRENT file does not end with newline");
    Slice::Slice((Slice *)((long)&dscname.field_2 + 8));
    Status::Corruption((Status *)this,&local_80,(Slice *)((long)&dscname.field_2 + 8));
    local_6c = 1;
  }
  else {
    Status::Status((Status *)this,&local_48);
    local_6c = 1;
  }
LAB_0013250e:
  Status::~Status(&local_48);
  std::__cxx11::string::~string((string *)&s);
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::Recover(bool* save_manifest) {
  struct LogReporter : public log::Reader::Reporter {
    Status* status;
    void Corruption(size_t bytes, const Status& s) override {
      if (this->status->ok()) *this->status = s;
    }
  };

  // Read "CURRENT" file, which contains a pointer to the current manifest file
  std::string current;
  Status s = ReadFileToString(env_, CurrentFileName(dbname_), &current);
  if (!s.ok()) {
    return s;
  }
  if (current.empty() || current[current.size() - 1] != '\n') {
    return Status::Corruption("CURRENT file does not end with newline");
  }
  current.resize(current.size() - 1);

  std::string dscname = dbname_ + "/" + current;
  SequentialFile* file;
  s = env_->NewSequentialFile(dscname, &file);
  if (!s.ok()) {
    if (s.IsNotFound()) {
      return Status::Corruption("CURRENT points to a non-existent file",
                                s.ToString());
    }
    return s;
  }

  bool have_log_number = false;
  bool have_prev_log_number = false;
  bool have_next_file = false;
  bool have_last_sequence = false;
  uint64_t next_file = 0;
  uint64_t last_sequence = 0;
  uint64_t log_number = 0;
  uint64_t prev_log_number = 0;
  Builder builder(this, current_);

  {
    LogReporter reporter;
    reporter.status = &s;
    log::Reader reader(file, &reporter, true /*checksum*/,
                       0 /*initial_offset*/);
    Slice record;
    std::string scratch;
    while (reader.ReadRecord(&record, &scratch) && s.ok()) {
      VersionEdit edit;
      s = edit.DecodeFrom(record);
      if (s.ok()) {
        if (edit.has_comparator_ &&
            edit.comparator_ != icmp_.user_comparator()->Name()) {
          s = Status::InvalidArgument(
              edit.comparator_ + " does not match existing comparator ",
              icmp_.user_comparator()->Name());
        }
      }

      if (s.ok()) {
        builder.Apply(&edit);
      }

      if (edit.has_log_number_) {
        log_number = edit.log_number_;
        have_log_number = true;
      }

      if (edit.has_prev_log_number_) {
        prev_log_number = edit.prev_log_number_;
        have_prev_log_number = true;
      }

      if (edit.has_next_file_number_) {
        next_file = edit.next_file_number_;
        have_next_file = true;
      }

      if (edit.has_last_sequence_) {
        last_sequence = edit.last_sequence_;
        have_last_sequence = true;
      }
    }
  }
  delete file;
  file = nullptr;

  if (s.ok()) {
    if (!have_next_file) {
      s = Status::Corruption("no meta-nextfile entry in descriptor");
    } else if (!have_log_number) {
      s = Status::Corruption("no meta-lognumber entry in descriptor");
    } else if (!have_last_sequence) {
      s = Status::Corruption("no last-sequence-number entry in descriptor");
    }

    if (!have_prev_log_number) {
      prev_log_number = 0;
    }

    MarkFileNumberUsed(prev_log_number);
    MarkFileNumberUsed(log_number);
  }

  if (s.ok()) {
    Version* v = new Version(this);
    builder.SaveTo(v);
    // Install recovered version
    Finalize(v);
    AppendVersion(v);
    manifest_file_number_ = next_file;
    next_file_number_ = next_file + 1;
    last_sequence_ = last_sequence;
    log_number_ = log_number;
    prev_log_number_ = prev_log_number;

    // See if we can reuse the existing MANIFEST file.
    if (ReuseManifest(dscname, current)) {
      // No need to save new manifest
    } else {
      *save_manifest = true;
    }
  }

  return s;
}